

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory_oob
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  xml_memory_page *pxVar1;
  xml_memory_page *pxVar2;
  size_t *psVar3;
  long lVar4;
  
  lVar4 = 0x8000;
  if (0x1ff6 < size) {
    lVar4 = size + 0x28;
  }
  pxVar2 = (xml_memory_page *)
           (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                     (lVar4);
  if (pxVar2 == (xml_memory_page *)0x0) {
    *out_page = (xml_memory_page *)0x0;
    pxVar2 = (xml_memory_page *)0x0;
  }
  else {
    pxVar2->freed_size = 0;
    pxVar2->allocator = (xml_allocator *)0x0;
    pxVar2->prev = (xml_memory_page *)0x0;
    pxVar2->next = (xml_memory_page *)0x0;
    pxVar2->busy_size = 0;
    pxVar2->allocator = this->_root->allocator;
    *out_page = pxVar2;
    if (size < 0x1ff7) {
      pxVar1 = this->_root;
      psVar3 = &this->_busy_size;
      pxVar1->busy_size = this->_busy_size;
      pxVar2->prev = pxVar1;
      pxVar1->next = pxVar2;
      this->_root = pxVar2;
    }
    else {
      pxVar1 = this->_root;
      if (pxVar1->prev == (xml_memory_page *)0x0) {
        __assert_fail("_root->prev",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2db,
                      "void *pugi::impl::(anonymous namespace)::xml_allocator::allocate_memory_oob(size_t, xml_memory_page *&)"
                     );
      }
      pxVar2->prev = pxVar1->prev;
      pxVar2->next = pxVar1;
      pxVar1->prev->next = pxVar2;
      pxVar1->prev = pxVar2;
      psVar3 = &pxVar2->busy_size;
    }
    pxVar2 = pxVar2 + 1;
    *psVar3 = size;
  }
  return pxVar2;
}

Assistant:

PUGI__FN_NO_INLINE void* xml_allocator::allocate_memory_oob(size_t size, xml_memory_page*& out_page)
	{
		const size_t large_allocation_threshold = xml_memory_page_size / 4;

		xml_memory_page* page = allocate_page(size <= large_allocation_threshold ? xml_memory_page_size : size);
		out_page = page;

		if (!page) return 0;

		if (size <= large_allocation_threshold)
		{
			_root->busy_size = _busy_size;

			// insert page at the end of linked list
			page->prev = _root;
			_root->next = page;
			_root = page;

			_busy_size = size;
		}
		else
		{
			// insert page before the end of linked list, so that it is deleted as soon as possible
			// the last page is not deleted even if it's empty (see deallocate_memory)
			assert(_root->prev);

			page->prev = _root->prev;
			page->next = _root;

			_root->prev->next = page;
			_root->prev = page;

			page->busy_size = size;
		}

		return reinterpret_cast<char*>(page) + sizeof(xml_memory_page);
	}